

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

int xlsxioread_sheet_next_row(xlsxioreadersheet sheethandle)

{
  XML_Status XVar1;
  uint uVar2;
  
  if (sheethandle == (xlsxioreadersheet)0x0) {
    return 0;
  }
  sheethandle->lastcolnr = 0;
  if (sheethandle->paddingrow == 0) {
    sheethandle->paddingcol = 0;
    do {
      XVar1 = expat_process_zip_file_resume
                        (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser);
      if (XVar1 != XML_STATUS_SUSPENDED) break;
    } while ((sheethandle->processcallbackdata).colnr != 0);
    uVar2 = (uint)(XVar1 == XML_STATUS_SUSPENDED);
  }
  else if (sheethandle->paddingrow < (sheethandle->processcallbackdata).rownr) {
    uVar2 = 3;
  }
  else {
    sheethandle->paddingrow = 0;
    uVar2 = 2;
  }
  return uVar2;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxioread_sheet_next_row (xlsxioreadersheet sheethandle)
{
  enum XML_Status status;
  if (!sheethandle) {
    return 0;
  }
  sheethandle->lastcolnr = 0;
  //when padding rows don't retrieve new data
  if (sheethandle->paddingrow) {
    if (sheethandle->paddingrow < sheethandle->processcallbackdata.rownr) {
      return 3;
    } else {
      sheethandle->paddingrow = 0;
      return 2;
    }
  }
  sheethandle->paddingcol = 0;
  //go to beginning of next row
  while ((status = expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser)) == XML_STATUS_SUSPENDED && sheethandle->processcallbackdata.colnr != 0) {
  }
  return (status == XML_STATUS_SUSPENDED ? 1 : 0);
}